

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>>>
::unchecked_insert<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>const&>
          (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
           *this,pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_> *x)

{
  size_t pos0;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
  *in_RSI;
  type_index *in_RDI;
  size_t hash;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
  *in_stack_ffffffffffffffd0;
  pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_> *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  key_from<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>>
            ((pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_> *)0x257c61);
  pos0 = table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
         ::hash_for<std::type_index>(in_stack_ffffffffffffffd0,in_RDI);
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
  ::position_for(in_stack_ffffffffffffffd0,(size_t)in_RDI);
  unchecked_emplace_at<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>const&>
            (in_RSI,pos0,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void unchecked_insert(Value&& x) {
        auto hash = hash_for(key_from(x));
        unchecked_emplace_at(position_for(hash), hash, std::forward<Value>(x));
    }